

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void iadst4_sse2(__m128i *input,__m128i *output)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  long lVar33;
  long in_RSI;
  undefined8 *in_RDI;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  __m128i out1;
  __m128i out0;
  int i;
  __m128i rounding;
  __m128i x2 [8];
  __m128i x1 [16];
  __m128i u [4];
  __m128i x0 [4];
  __m128i sinpi_m03_m01;
  __m128i sinpi_p04_p02;
  __m128i sinpi_0_p03;
  __m128i sinpi_p03_m03;
  __m128i sinpi_p03_m04;
  __m128i sinpi_p03_p02;
  __m128i sinpi_p02_m01;
  __m128i sinpi_p01_p04;
  int32_t *sinpi;
  int local_81c;
  int local_808 [2];
  undefined8 uStack_800;
  int local_7f8;
  int iStack_7f4;
  int iStack_7f0;
  int iStack_7ec;
  int local_7e8;
  int iStack_7e4;
  int iStack_7e0;
  int iStack_7dc;
  int local_7d8;
  int iStack_7d4;
  int iStack_7d0;
  int iStack_7cc;
  int local_7c8;
  int iStack_7c4;
  int iStack_7c0;
  int iStack_7bc;
  int local_7b8;
  int iStack_7b4;
  int iStack_7b0;
  int iStack_7ac;
  int local_7a8;
  int iStack_7a4;
  int iStack_7a0;
  int iStack_79c;
  int local_798;
  int iStack_794;
  int iStack_790;
  int iStack_78c;
  undefined1 local_788 [16];
  undefined1 local_778 [16];
  undefined1 local_768 [16];
  undefined1 local_758 [16];
  undefined1 local_748 [16];
  undefined1 local_738 [16];
  undefined1 local_728 [16];
  undefined1 local_718 [16];
  undefined1 local_708 [16];
  undefined1 local_6f8 [16];
  undefined1 local_6e8 [16];
  undefined1 local_6d8 [16];
  undefined1 local_6c8 [16];
  undefined1 local_6b8 [16];
  undefined1 local_6a8 [16];
  undefined1 local_698 [16];
  undefined2 local_688;
  undefined2 uStack_686;
  undefined2 uStack_684;
  undefined2 uStack_682;
  undefined2 uStack_680;
  undefined2 uStack_67e;
  undefined2 uStack_67c;
  undefined2 uStack_67a;
  undefined2 local_678;
  undefined2 uStack_676;
  undefined2 uStack_674;
  undefined2 uStack_672;
  undefined2 uStack_670;
  undefined2 uStack_66e;
  undefined2 uStack_66c;
  undefined2 uStack_66a;
  undefined2 local_668;
  undefined2 uStack_666;
  undefined2 uStack_664;
  undefined2 uStack_662;
  undefined2 uStack_660;
  undefined2 uStack_65e;
  undefined2 uStack_65c;
  undefined2 uStack_65a;
  undefined2 local_658;
  undefined2 uStack_656;
  undefined2 uStack_654;
  undefined2 uStack_652;
  undefined2 uStack_650;
  undefined2 uStack_64e;
  undefined2 uStack_64c;
  undefined2 uStack_64a;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  int32_t *local_588;
  long local_580;
  undefined8 *local_578;
  undefined4 local_56c;
  int local_568;
  uint local_564;
  int local_560;
  int local_55c;
  int local_558;
  uint local_554;
  int local_550;
  uint local_54c;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined4 local_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined4 local_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  uint local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_10;
  undefined4 local_c;
  undefined4 local_8;
  undefined4 local_4;
  
  local_580 = in_RSI;
  local_578 = in_RDI;
  local_588 = sinpi_arr(0xc);
  local_54c = (uint)*(ushort *)(local_588 + 1) | local_588[4] << 0x10;
  local_10c = local_54c;
  local_110 = local_54c;
  local_114 = local_54c;
  local_118 = local_54c;
  local_128 = CONCAT44(local_54c,local_54c);
  uStack_120 = CONCAT44(local_54c,local_54c);
  local_598 = local_128;
  uStack_590 = uStack_120;
  local_550 = (uint)*(ushort *)(local_588 + 2) + local_588[1] * -0x10000;
  local_ec = local_550;
  local_f0 = local_550;
  local_f4 = local_550;
  local_f8 = local_550;
  local_108 = CONCAT44(local_550,local_550);
  uStack_100 = CONCAT44(local_550,local_550);
  local_5a8 = local_108;
  uStack_5a0 = uStack_100;
  local_554 = (uint)*(ushort *)(local_588 + 3) | local_588[2] << 0x10;
  local_cc = local_554;
  local_d0 = local_554;
  local_d4 = local_554;
  local_d8 = local_554;
  local_e8 = CONCAT44(local_554,local_554);
  uStack_e0 = CONCAT44(local_554,local_554);
  local_5b8 = local_e8;
  uStack_5b0 = uStack_e0;
  local_558 = (uint)*(ushort *)(local_588 + 3) + local_588[4] * -0x10000;
  local_ac = local_558;
  local_b0 = local_558;
  local_b4 = local_558;
  local_b8 = local_558;
  local_c8 = CONCAT44(local_558,local_558);
  uStack_c0 = CONCAT44(local_558,local_558);
  local_5c8 = local_c8;
  uStack_5c0 = uStack_c0;
  local_55c = (local_588[3] & 0xffffU) + local_588[3] * -0x10000;
  local_8c = local_55c;
  local_90 = local_55c;
  local_94 = local_55c;
  local_98 = local_55c;
  local_a8 = CONCAT44(local_55c,local_55c);
  uStack_a0 = CONCAT44(local_55c,local_55c);
  local_5d8 = local_a8;
  uStack_5d0 = uStack_a0;
  local_560 = local_588[3] << 0x10;
  local_6c = local_560;
  local_70 = local_560;
  local_74 = local_560;
  local_78 = local_560;
  local_88 = CONCAT44(local_560,local_560);
  uStack_80 = CONCAT44(local_560,local_560);
  local_5e8 = local_88;
  uStack_5e0 = uStack_80;
  local_564 = (uint)*(ushort *)(local_588 + 4) | local_588[2] << 0x10;
  local_4c = local_564;
  local_50 = local_564;
  local_54 = local_564;
  local_58 = local_564;
  local_68 = CONCAT44(local_564,local_564);
  uStack_60 = CONCAT44(local_564,local_564);
  local_5f8 = local_68;
  uStack_5f0 = uStack_60;
  local_568 = (-local_588[3] & 0xffffU) + local_588[1] * -0x10000;
  local_2c = local_568;
  local_30 = local_568;
  local_34 = local_568;
  local_38 = local_568;
  local_48 = CONCAT44(local_568,local_568);
  uStack_40 = CONCAT44(local_568,local_568);
  local_608 = local_48;
  uStack_600 = uStack_40;
  local_648 = *local_578;
  uStack_640 = local_578[1];
  local_638 = local_578[2];
  uStack_630 = local_578[3];
  local_628 = local_578[4];
  uStack_620 = local_578[5];
  local_618 = local_578[6];
  uStack_610 = local_578[7];
  local_518 = local_648;
  uStack_510 = uStack_640;
  local_528 = local_628;
  uStack_520 = uStack_620;
  local_518._0_2_ = (undefined2)local_648;
  local_518._2_2_ = (undefined2)((ulong)local_648 >> 0x10);
  local_518._4_2_ = (undefined2)((ulong)local_648 >> 0x20);
  local_518._6_2_ = (undefined2)((ulong)local_648 >> 0x30);
  local_528._0_2_ = (undefined2)local_628;
  local_528._2_2_ = (undefined2)((ulong)local_628 >> 0x10);
  local_528._4_2_ = (undefined2)((ulong)local_628 >> 0x20);
  local_528._6_2_ = (undefined2)((ulong)local_628 >> 0x30);
  local_688 = (undefined2)local_518;
  uStack_686 = (undefined2)local_528;
  uStack_684 = local_518._2_2_;
  uStack_682 = local_528._2_2_;
  uStack_680 = local_518._4_2_;
  uStack_67e = local_528._4_2_;
  uStack_67c = local_518._6_2_;
  uStack_67a = local_528._6_2_;
  local_4d8 = local_648;
  uStack_4d0 = uStack_640;
  local_4e8 = local_628;
  uStack_4e0 = uStack_620;
  uStack_4d0._0_2_ = (undefined2)uStack_640;
  uStack_4d0._2_2_ = (undefined2)((ulong)uStack_640 >> 0x10);
  uStack_4d0._4_2_ = (undefined2)((ulong)uStack_640 >> 0x20);
  uStack_4d0._6_2_ = (undefined2)((ulong)uStack_640 >> 0x30);
  uStack_4e0._0_2_ = (undefined2)uStack_620;
  uStack_4e0._2_2_ = (undefined2)((ulong)uStack_620 >> 0x10);
  uStack_4e0._4_2_ = (undefined2)((ulong)uStack_620 >> 0x20);
  uStack_4e0._6_2_ = (undefined2)((ulong)uStack_620 >> 0x30);
  local_678 = (undefined2)uStack_4d0;
  uStack_676 = (undefined2)uStack_4e0;
  uStack_674 = uStack_4d0._2_2_;
  uStack_672 = uStack_4e0._2_2_;
  uStack_670 = uStack_4d0._4_2_;
  uStack_66e = uStack_4e0._4_2_;
  uStack_66c = uStack_4d0._6_2_;
  uStack_66a = uStack_4e0._6_2_;
  local_538 = local_638;
  uStack_530 = uStack_630;
  local_548 = local_618;
  uStack_540 = uStack_610;
  local_538._0_2_ = (undefined2)local_638;
  local_538._2_2_ = (undefined2)((ulong)local_638 >> 0x10);
  local_538._4_2_ = (undefined2)((ulong)local_638 >> 0x20);
  local_538._6_2_ = (undefined2)((ulong)local_638 >> 0x30);
  local_548._0_2_ = (undefined2)local_618;
  local_548._2_2_ = (undefined2)((ulong)local_618 >> 0x10);
  local_548._4_2_ = (undefined2)((ulong)local_618 >> 0x20);
  local_548._6_2_ = (undefined2)((ulong)local_618 >> 0x30);
  local_668 = (undefined2)local_538;
  uStack_666 = (undefined2)local_548;
  uStack_664 = local_538._2_2_;
  uStack_662 = local_548._2_2_;
  uStack_660 = local_538._4_2_;
  uStack_65e = local_548._4_2_;
  uStack_65c = local_538._6_2_;
  uStack_65a = local_548._6_2_;
  local_4f8 = local_638;
  uStack_4f0 = uStack_630;
  local_508 = local_618;
  uStack_500 = uStack_610;
  uStack_4f0._0_2_ = (undefined2)uStack_630;
  uStack_4f0._2_2_ = (undefined2)((ulong)uStack_630 >> 0x10);
  uStack_4f0._4_2_ = (undefined2)((ulong)uStack_630 >> 0x20);
  uStack_4f0._6_2_ = (undefined2)((ulong)uStack_630 >> 0x30);
  uStack_500._0_2_ = (undefined2)uStack_610;
  uStack_500._2_2_ = (undefined2)((ulong)uStack_610 >> 0x10);
  uStack_500._4_2_ = (undefined2)((ulong)uStack_610 >> 0x20);
  uStack_500._6_2_ = (undefined2)((ulong)uStack_610 >> 0x30);
  local_658 = (undefined2)uStack_4f0;
  uStack_656 = (undefined2)uStack_500;
  uStack_654 = uStack_4f0._2_2_;
  uStack_652 = uStack_500._2_2_;
  uStack_650 = uStack_4f0._4_2_;
  uStack_64e = uStack_500._4_2_;
  uStack_64c = uStack_4f0._6_2_;
  uStack_64a = uStack_500._6_2_;
  local_2d8 = CONCAT26(local_528._2_2_,
                       CONCAT24(local_518._2_2_,
                                CONCAT22((undefined2)local_528,(undefined2)local_518)));
  uStack_2d0 = CONCAT26(local_528._6_2_,
                        CONCAT24(local_518._6_2_,CONCAT22(local_528._4_2_,local_518._4_2_)));
  local_2e8 = local_128;
  uStack_2e0 = uStack_120;
  auVar30._8_8_ = uStack_2d0;
  auVar30._0_8_ = local_2d8;
  auVar29._8_8_ = uStack_120;
  auVar29._0_8_ = local_128;
  local_788 = pmaddwd(auVar30,auVar29);
  local_2f8 = CONCAT26(uStack_4e0._2_2_,
                       CONCAT24(uStack_4d0._2_2_,
                                CONCAT22((undefined2)uStack_4e0,(undefined2)uStack_4d0)));
  uStack_2f0 = CONCAT26(uStack_4e0._6_2_,
                        CONCAT24(uStack_4d0._6_2_,CONCAT22(uStack_4e0._4_2_,uStack_4d0._4_2_)));
  local_308 = local_128;
  uStack_300 = uStack_120;
  auVar28._8_8_ = uStack_2f0;
  auVar28._0_8_ = local_2f8;
  auVar27._8_8_ = uStack_120;
  auVar27._0_8_ = local_128;
  local_778 = pmaddwd(auVar28,auVar27);
  local_318 = CONCAT26(local_528._2_2_,
                       CONCAT24(local_518._2_2_,
                                CONCAT22((undefined2)local_528,(undefined2)local_518)));
  uStack_310 = CONCAT26(local_528._6_2_,
                        CONCAT24(local_518._6_2_,CONCAT22(local_528._4_2_,local_518._4_2_)));
  local_328 = local_108;
  uStack_320 = uStack_100;
  auVar26._8_8_ = uStack_310;
  auVar26._0_8_ = local_318;
  auVar25._8_8_ = uStack_100;
  auVar25._0_8_ = local_108;
  local_768 = pmaddwd(auVar26,auVar25);
  local_338 = CONCAT26(uStack_4e0._2_2_,
                       CONCAT24(uStack_4d0._2_2_,
                                CONCAT22((undefined2)uStack_4e0,(undefined2)uStack_4d0)));
  uStack_330 = CONCAT26(uStack_4e0._6_2_,
                        CONCAT24(uStack_4d0._6_2_,CONCAT22(uStack_4e0._4_2_,uStack_4d0._4_2_)));
  local_348 = local_108;
  uStack_340 = uStack_100;
  auVar24._8_8_ = uStack_330;
  auVar24._0_8_ = local_338;
  auVar23._8_8_ = uStack_100;
  auVar23._0_8_ = local_108;
  local_758 = pmaddwd(auVar24,auVar23);
  local_358 = CONCAT26(local_548._2_2_,
                       CONCAT24(local_538._2_2_,
                                CONCAT22((undefined2)local_548,(undefined2)local_538)));
  uStack_350 = CONCAT26(local_548._6_2_,
                        CONCAT24(local_538._6_2_,CONCAT22(local_548._4_2_,local_538._4_2_)));
  local_368 = local_e8;
  uStack_360 = uStack_e0;
  auVar22._8_8_ = uStack_350;
  auVar22._0_8_ = local_358;
  auVar21._8_8_ = uStack_e0;
  auVar21._0_8_ = local_e8;
  local_748 = pmaddwd(auVar22,auVar21);
  local_378 = CONCAT26(uStack_500._2_2_,
                       CONCAT24(uStack_4f0._2_2_,
                                CONCAT22((undefined2)uStack_500,(undefined2)uStack_4f0)));
  uStack_370 = CONCAT26(uStack_500._6_2_,
                        CONCAT24(uStack_4f0._6_2_,CONCAT22(uStack_500._4_2_,uStack_4f0._4_2_)));
  local_388 = local_e8;
  uStack_380 = uStack_e0;
  auVar20._8_8_ = uStack_370;
  auVar20._0_8_ = local_378;
  auVar19._8_8_ = uStack_e0;
  auVar19._0_8_ = local_e8;
  local_738 = pmaddwd(auVar20,auVar19);
  local_398 = CONCAT26(local_548._2_2_,
                       CONCAT24(local_538._2_2_,
                                CONCAT22((undefined2)local_548,(undefined2)local_538)));
  uStack_390 = CONCAT26(local_548._6_2_,
                        CONCAT24(local_538._6_2_,CONCAT22(local_548._4_2_,local_538._4_2_)));
  local_3a8 = local_c8;
  uStack_3a0 = uStack_c0;
  auVar18._8_8_ = uStack_390;
  auVar18._0_8_ = local_398;
  auVar17._8_8_ = uStack_c0;
  auVar17._0_8_ = local_c8;
  local_728 = pmaddwd(auVar18,auVar17);
  local_3b8 = CONCAT26(uStack_500._2_2_,
                       CONCAT24(uStack_4f0._2_2_,
                                CONCAT22((undefined2)uStack_500,(undefined2)uStack_4f0)));
  uStack_3b0 = CONCAT26(uStack_500._6_2_,
                        CONCAT24(uStack_4f0._6_2_,CONCAT22(uStack_500._4_2_,uStack_4f0._4_2_)));
  local_3c8 = local_c8;
  uStack_3c0 = uStack_c0;
  auVar16._8_8_ = uStack_3b0;
  auVar16._0_8_ = local_3b8;
  auVar15._8_8_ = uStack_c0;
  auVar15._0_8_ = local_c8;
  local_718 = pmaddwd(auVar16,auVar15);
  local_3d8 = CONCAT26(local_528._2_2_,
                       CONCAT24(local_518._2_2_,
                                CONCAT22((undefined2)local_528,(undefined2)local_518)));
  uStack_3d0 = CONCAT26(local_528._6_2_,
                        CONCAT24(local_518._6_2_,CONCAT22(local_528._4_2_,local_518._4_2_)));
  local_3e8 = local_a8;
  uStack_3e0 = uStack_a0;
  auVar14._8_8_ = uStack_3d0;
  auVar14._0_8_ = local_3d8;
  auVar13._8_8_ = uStack_a0;
  auVar13._0_8_ = local_a8;
  local_708 = pmaddwd(auVar14,auVar13);
  local_3f8 = CONCAT26(uStack_4e0._2_2_,
                       CONCAT24(uStack_4d0._2_2_,
                                CONCAT22((undefined2)uStack_4e0,(undefined2)uStack_4d0)));
  uStack_3f0 = CONCAT26(uStack_4e0._6_2_,
                        CONCAT24(uStack_4d0._6_2_,CONCAT22(uStack_4e0._4_2_,uStack_4d0._4_2_)));
  local_408 = local_a8;
  uStack_400 = uStack_a0;
  auVar12._8_8_ = uStack_3f0;
  auVar12._0_8_ = local_3f8;
  auVar11._8_8_ = uStack_a0;
  auVar11._0_8_ = local_a8;
  local_6f8 = pmaddwd(auVar12,auVar11);
  local_418 = CONCAT26(local_548._2_2_,
                       CONCAT24(local_538._2_2_,
                                CONCAT22((undefined2)local_548,(undefined2)local_538)));
  uStack_410 = CONCAT26(local_548._6_2_,
                        CONCAT24(local_538._6_2_,CONCAT22(local_548._4_2_,local_538._4_2_)));
  local_428 = local_88;
  uStack_420 = uStack_80;
  auVar10._8_8_ = uStack_410;
  auVar10._0_8_ = local_418;
  auVar9._8_8_ = uStack_80;
  auVar9._0_8_ = local_88;
  local_6e8 = pmaddwd(auVar10,auVar9);
  local_438 = CONCAT26(uStack_500._2_2_,
                       CONCAT24(uStack_4f0._2_2_,
                                CONCAT22((undefined2)uStack_500,(undefined2)uStack_4f0)));
  uStack_430 = CONCAT26(uStack_500._6_2_,
                        CONCAT24(uStack_4f0._6_2_,CONCAT22(uStack_500._4_2_,uStack_4f0._4_2_)));
  local_448 = local_88;
  uStack_440 = uStack_80;
  auVar8._8_8_ = uStack_430;
  auVar8._0_8_ = local_438;
  auVar7._8_8_ = uStack_80;
  auVar7._0_8_ = local_88;
  local_6d8 = pmaddwd(auVar8,auVar7);
  local_458 = CONCAT26(local_528._2_2_,
                       CONCAT24(local_518._2_2_,
                                CONCAT22((undefined2)local_528,(undefined2)local_518)));
  uStack_450 = CONCAT26(local_528._6_2_,
                        CONCAT24(local_518._6_2_,CONCAT22(local_528._4_2_,local_518._4_2_)));
  local_468 = local_68;
  uStack_460 = uStack_60;
  auVar6._8_8_ = uStack_450;
  auVar6._0_8_ = local_458;
  auVar5._8_8_ = uStack_60;
  auVar5._0_8_ = local_68;
  local_6c8 = pmaddwd(auVar6,auVar5);
  local_478 = CONCAT26(uStack_4e0._2_2_,
                       CONCAT24(uStack_4d0._2_2_,
                                CONCAT22((undefined2)uStack_4e0,(undefined2)uStack_4d0)));
  uStack_470 = CONCAT26(uStack_4e0._6_2_,
                        CONCAT24(uStack_4d0._6_2_,CONCAT22(uStack_4e0._4_2_,uStack_4d0._4_2_)));
  local_488 = local_68;
  uStack_480 = uStack_60;
  auVar4._8_8_ = uStack_470;
  auVar4._0_8_ = local_478;
  auVar3._8_8_ = uStack_60;
  auVar3._0_8_ = local_68;
  local_6b8 = pmaddwd(auVar4,auVar3);
  local_498 = CONCAT26(local_548._2_2_,
                       CONCAT24(local_538._2_2_,
                                CONCAT22((undefined2)local_548,(undefined2)local_538)));
  uStack_490 = CONCAT26(local_548._6_2_,
                        CONCAT24(local_538._6_2_,CONCAT22(local_548._4_2_,local_538._4_2_)));
  local_4a8 = local_48;
  uStack_4a0 = uStack_40;
  auVar2._8_8_ = uStack_490;
  auVar2._0_8_ = local_498;
  auVar1._8_8_ = uStack_40;
  auVar1._0_8_ = local_48;
  local_6a8 = pmaddwd(auVar2,auVar1);
  local_4b8 = CONCAT26(uStack_500._2_2_,
                       CONCAT24(uStack_4f0._2_2_,
                                CONCAT22((undefined2)uStack_500,(undefined2)uStack_4f0)));
  uStack_4b0 = CONCAT26(uStack_500._6_2_,
                        CONCAT24(uStack_4f0._6_2_,CONCAT22(uStack_500._4_2_,uStack_4f0._4_2_)));
  local_4c8 = local_48;
  uStack_4c0 = uStack_40;
  auVar35._8_8_ = uStack_4b0;
  auVar35._0_8_ = local_4b8;
  auVar34._8_8_ = uStack_40;
  auVar34._0_8_ = local_48;
  local_698 = pmaddwd(auVar35,auVar34);
  local_198 = local_788._0_8_;
  uStack_190 = local_788._8_8_;
  local_1a8 = local_748._0_8_;
  uStack_1a0 = local_748._8_8_;
  local_198._0_4_ = local_788._0_4_;
  local_198._4_4_ = local_788._4_4_;
  uStack_190._0_4_ = local_788._8_4_;
  uStack_190._4_4_ = local_788._12_4_;
  local_1a8._0_4_ = local_748._0_4_;
  local_1a8._4_4_ = local_748._4_4_;
  uStack_1a0._0_4_ = local_748._8_4_;
  uStack_1a0._4_4_ = local_748._12_4_;
  local_808[0] = (int)local_198 + (int)local_1a8;
  local_808[1] = local_198._4_4_ + local_1a8._4_4_;
  uStack_800._0_4_ = (int)uStack_190 + (int)uStack_1a0;
  uStack_800._4_4_ = uStack_190._4_4_ + uStack_1a0._4_4_;
  local_1b8 = local_778._0_8_;
  uStack_1b0 = local_778._8_8_;
  local_1c8 = local_738._0_8_;
  uStack_1c0 = local_738._8_8_;
  local_1b8._0_4_ = local_778._0_4_;
  local_1b8._4_4_ = local_778._4_4_;
  uStack_1b0._0_4_ = local_778._8_4_;
  uStack_1b0._4_4_ = local_778._12_4_;
  local_1c8._0_4_ = local_738._0_4_;
  local_1c8._4_4_ = local_738._4_4_;
  uStack_1c0._0_4_ = local_738._8_4_;
  uStack_1c0._4_4_ = local_738._12_4_;
  local_7f8 = (int)local_1b8 + (int)local_1c8;
  iStack_7f4 = local_1b8._4_4_ + local_1c8._4_4_;
  iStack_7f0 = (int)uStack_1b0 + (int)uStack_1c0;
  iStack_7ec = uStack_1b0._4_4_ + uStack_1c0._4_4_;
  local_1d8 = local_768._0_8_;
  uStack_1d0 = local_768._8_8_;
  local_1e8 = local_728._0_8_;
  uStack_1e0 = local_728._8_8_;
  local_1d8._0_4_ = local_768._0_4_;
  local_1d8._4_4_ = local_768._4_4_;
  uStack_1d0._0_4_ = local_768._8_4_;
  uStack_1d0._4_4_ = local_768._12_4_;
  local_1e8._0_4_ = local_728._0_4_;
  local_1e8._4_4_ = local_728._4_4_;
  uStack_1e0._0_4_ = local_728._8_4_;
  uStack_1e0._4_4_ = local_728._12_4_;
  local_7e8 = (int)local_1d8 + (int)local_1e8;
  iStack_7e4 = local_1d8._4_4_ + local_1e8._4_4_;
  iStack_7e0 = (int)uStack_1d0 + (int)uStack_1e0;
  iStack_7dc = uStack_1d0._4_4_ + uStack_1e0._4_4_;
  local_1f8 = local_758._0_8_;
  uStack_1f0 = local_758._8_8_;
  local_208 = local_718._0_8_;
  uStack_200 = local_718._8_8_;
  local_1f8._0_4_ = local_758._0_4_;
  local_1f8._4_4_ = local_758._4_4_;
  uStack_1f0._0_4_ = local_758._8_4_;
  uStack_1f0._4_4_ = local_758._12_4_;
  local_208._0_4_ = local_718._0_4_;
  local_208._4_4_ = local_718._4_4_;
  uStack_200._0_4_ = local_718._8_4_;
  uStack_200._4_4_ = local_718._12_4_;
  local_7d8 = (int)local_1f8 + (int)local_208;
  iStack_7d4 = local_1f8._4_4_ + local_208._4_4_;
  iStack_7d0 = (int)uStack_1f0 + (int)uStack_200;
  iStack_7cc = uStack_1f0._4_4_ + uStack_200._4_4_;
  local_218 = local_708._0_8_;
  uStack_210 = local_708._8_8_;
  local_228 = local_6e8._0_8_;
  uStack_220 = local_6e8._8_8_;
  local_218._0_4_ = local_708._0_4_;
  local_218._4_4_ = local_708._4_4_;
  uStack_210._0_4_ = local_708._8_4_;
  uStack_210._4_4_ = local_708._12_4_;
  local_228._0_4_ = local_6e8._0_4_;
  local_228._4_4_ = local_6e8._4_4_;
  uStack_220._0_4_ = local_6e8._8_4_;
  uStack_220._4_4_ = local_6e8._12_4_;
  local_7c8 = (int)local_218 + (int)local_228;
  iStack_7c4 = local_218._4_4_ + local_228._4_4_;
  iStack_7c0 = (int)uStack_210 + (int)uStack_220;
  iStack_7bc = uStack_210._4_4_ + uStack_220._4_4_;
  local_238 = local_6f8._0_8_;
  uStack_230 = local_6f8._8_8_;
  local_248 = local_6d8._0_8_;
  uStack_240 = local_6d8._8_8_;
  local_238._0_4_ = local_6f8._0_4_;
  local_238._4_4_ = local_6f8._4_4_;
  uStack_230._0_4_ = local_6f8._8_4_;
  uStack_230._4_4_ = local_6f8._12_4_;
  local_248._0_4_ = local_6d8._0_4_;
  local_248._4_4_ = local_6d8._4_4_;
  uStack_240._0_4_ = local_6d8._8_4_;
  uStack_240._4_4_ = local_6d8._12_4_;
  local_7b8 = (int)local_238 + (int)local_248;
  iStack_7b4 = local_238._4_4_ + local_248._4_4_;
  iStack_7b0 = (int)uStack_230 + (int)uStack_240;
  iStack_7ac = uStack_230._4_4_ + uStack_240._4_4_;
  local_258 = local_6c8._0_8_;
  uStack_250 = local_6c8._8_8_;
  local_268 = local_6a8._0_8_;
  uStack_260 = local_6a8._8_8_;
  local_258._0_4_ = local_6c8._0_4_;
  local_258._4_4_ = local_6c8._4_4_;
  uStack_250._0_4_ = local_6c8._8_4_;
  uStack_250._4_4_ = local_6c8._12_4_;
  local_268._0_4_ = local_6a8._0_4_;
  local_268._4_4_ = local_6a8._4_4_;
  uStack_260._0_4_ = local_6a8._8_4_;
  uStack_260._4_4_ = local_6a8._12_4_;
  local_7a8 = (int)local_258 + (int)local_268;
  iStack_7a4 = local_258._4_4_ + local_268._4_4_;
  iStack_7a0 = (int)uStack_250 + (int)uStack_260;
  iStack_79c = uStack_250._4_4_ + uStack_260._4_4_;
  local_278 = local_6b8._0_8_;
  uStack_270 = local_6b8._8_8_;
  local_288 = local_698._0_8_;
  uStack_280 = local_698._8_8_;
  local_278._0_4_ = local_6b8._0_4_;
  local_278._4_4_ = local_6b8._4_4_;
  uStack_270._0_4_ = local_6b8._8_4_;
  uStack_270._4_4_ = local_6b8._12_4_;
  local_288._0_4_ = local_698._0_4_;
  local_288._4_4_ = local_698._4_4_;
  uStack_280._0_4_ = local_698._8_4_;
  uStack_280._4_4_ = local_698._12_4_;
  local_798 = (int)local_278 + (int)local_288;
  iStack_794 = local_278._4_4_ + local_288._4_4_;
  iStack_790 = (int)uStack_270 + (int)uStack_280;
  iStack_78c = uStack_270._4_4_ + uStack_280._4_4_;
  local_56c = 0x800;
  local_4 = 0x800;
  local_8 = 0x800;
  local_c = 0x800;
  local_10 = 0x800;
  local_28 = 0x80000000800;
  uStack_20 = 0x80000000800;
  for (local_81c = 0; local_81c < 4; local_81c = local_81c + 1) {
    local_298 = *(undefined8 *)(local_808 + (long)(local_81c << 1) * 4);
    uStack_290 = (&uStack_800)[(long)(local_81c << 1) * 2];
    local_2a8 = 0x80000000800;
    uStack_2a0 = 0x80000000800;
    local_298._4_4_ = (int)((ulong)local_298 >> 0x20);
    uStack_290._4_4_ = (int)((ulong)uStack_290 >> 0x20);
    lVar33 = (long)(local_81c * 2 + 1);
    local_2b8 = *(undefined8 *)(local_808 + lVar33 * 4);
    uStack_2b0 = (&uStack_800)[lVar33 * 2];
    local_2c8 = 0x80000000800;
    uStack_2c0 = 0x80000000800;
    local_2b8._4_4_ = (int)((ulong)local_2b8 >> 0x20);
    uStack_2b0._4_4_ = (int)((ulong)uStack_2b0 >> 0x20);
    local_158 = CONCAT44(local_298._4_4_ + 0x800,(int)local_298 + 0x800);
    uStack_150 = CONCAT44(uStack_290._4_4_ + 0x800,(int)uStack_290 + 0x800);
    local_15c = 0xc;
    auVar34 = ZEXT416(0xc);
    local_178 = CONCAT44(local_2b8._4_4_ + 0x800,(int)local_2b8 + 0x800);
    uStack_170 = CONCAT44(uStack_2b0._4_4_ + 0x800,(int)uStack_2b0 + 0x800);
    local_17c = 0xc;
    auVar35 = ZEXT416(0xc);
    local_138 = CONCAT44(local_298._4_4_ + 0x800 >> auVar34,(int)local_298 + 0x800 >> auVar34);
    uStack_130 = CONCAT44(uStack_290._4_4_ + 0x800 >> auVar34,(int)uStack_290 + 0x800 >> auVar34);
    local_148 = CONCAT44(local_2b8._4_4_ + 0x800 >> auVar35,(int)local_2b8 + 0x800 >> auVar35);
    uStack_140 = CONCAT44(uStack_2b0._4_4_ + 0x800 >> auVar35,(int)uStack_2b0 + 0x800 >> auVar35);
    auVar32._8_8_ = uStack_130;
    auVar32._0_8_ = local_138;
    auVar31._8_8_ = uStack_140;
    auVar31._0_8_ = local_148;
    auVar34 = packssdw(auVar32,auVar31);
    *(undefined1 (*) [16])(local_580 + (long)local_81c * 0x10) = auVar34;
  }
  return;
}

Assistant:

static void iadst4_sse2(const __m128i *input, __m128i *output) {
  const int32_t *sinpi = sinpi_arr(INV_COS_BIT);
  const __m128i sinpi_p01_p04 = pair_set_epi16(sinpi[1], sinpi[4]);
  const __m128i sinpi_p02_m01 = pair_set_epi16(sinpi[2], -sinpi[1]);
  const __m128i sinpi_p03_p02 = pair_set_epi16(sinpi[3], sinpi[2]);
  const __m128i sinpi_p03_m04 = pair_set_epi16(sinpi[3], -sinpi[4]);
  const __m128i sinpi_p03_m03 = pair_set_epi16(sinpi[3], -sinpi[3]);
  const __m128i sinpi_0_p03 = pair_set_epi16(0, sinpi[3]);
  const __m128i sinpi_p04_p02 = pair_set_epi16(sinpi[4], sinpi[2]);
  const __m128i sinpi_m03_m01 = pair_set_epi16(-sinpi[3], -sinpi[1]);
  __m128i x0[4];
  x0[0] = input[0];
  x0[1] = input[1];
  x0[2] = input[2];
  x0[3] = input[3];

  __m128i u[4];
  u[0] = _mm_unpacklo_epi16(x0[0], x0[2]);
  u[1] = _mm_unpackhi_epi16(x0[0], x0[2]);
  u[2] = _mm_unpacklo_epi16(x0[1], x0[3]);
  u[3] = _mm_unpackhi_epi16(x0[1], x0[3]);

  __m128i x1[16];
  x1[0] = _mm_madd_epi16(u[0], sinpi_p01_p04);  // x0*sin1 + x2*sin4
  x1[1] = _mm_madd_epi16(u[1], sinpi_p01_p04);
  x1[2] = _mm_madd_epi16(u[0], sinpi_p02_m01);  // x0*sin2 - x2*sin1
  x1[3] = _mm_madd_epi16(u[1], sinpi_p02_m01);
  x1[4] = _mm_madd_epi16(u[2], sinpi_p03_p02);  // x1*sin3 + x3*sin2
  x1[5] = _mm_madd_epi16(u[3], sinpi_p03_p02);
  x1[6] = _mm_madd_epi16(u[2], sinpi_p03_m04);  // x1*sin3 - x3*sin4
  x1[7] = _mm_madd_epi16(u[3], sinpi_p03_m04);
  x1[8] = _mm_madd_epi16(u[0], sinpi_p03_m03);  // x0*sin3 - x2*sin3
  x1[9] = _mm_madd_epi16(u[1], sinpi_p03_m03);
  x1[10] = _mm_madd_epi16(u[2], sinpi_0_p03);  // x2*sin3
  x1[11] = _mm_madd_epi16(u[3], sinpi_0_p03);
  x1[12] = _mm_madd_epi16(u[0], sinpi_p04_p02);  // x0*sin4 + x2*sin2
  x1[13] = _mm_madd_epi16(u[1], sinpi_p04_p02);
  x1[14] = _mm_madd_epi16(u[2], sinpi_m03_m01);  // -x1*sin3 - x3*sin1
  x1[15] = _mm_madd_epi16(u[3], sinpi_m03_m01);

  __m128i x2[8];
  x2[0] = _mm_add_epi32(x1[0], x1[4]);  // x0*sin1 +x2*sin4 +x1*sin3 +x3*sin2
  x2[1] = _mm_add_epi32(x1[1], x1[5]);
  x2[2] = _mm_add_epi32(x1[2], x1[6]);  // x0*sin2 -x2*sin1 +x1*sin3 -x3*sin4
  x2[3] = _mm_add_epi32(x1[3], x1[7]);
  x2[4] = _mm_add_epi32(x1[8], x1[10]);  // x0*sin3 -x2*sin3 +x3*sin3
  x2[5] = _mm_add_epi32(x1[9], x1[11]);
  x2[6] = _mm_add_epi32(x1[12], x1[14]);  // x0*sin1 +x2*sin4 +x0*sin2 -x2*sin1
  x2[7] = _mm_add_epi32(x1[13], x1[15]);

  const __m128i rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));
  for (int i = 0; i < 4; ++i) {
    __m128i out0 = _mm_add_epi32(x2[2 * i], rounding);
    __m128i out1 = _mm_add_epi32(x2[2 * i + 1], rounding);
    out0 = _mm_srai_epi32(out0, INV_COS_BIT);
    out1 = _mm_srai_epi32(out1, INV_COS_BIT);
    output[i] = _mm_packs_epi32(out0, out1);
  }
}